

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::generate_const(t_html_generator *this,t_const *tconst)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ostream *poVar2;
  string name;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)&tconst->name_);
  poVar1 = &this->f_out_;
  poVar2 = std::operator<<((ostream *)poVar1,"<tr id=\"Const_");
  poVar2 = std::operator<<(poVar2,asStack_38);
  poVar2 = std::operator<<(poVar2,"\"><td><code>");
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::operator<<(poVar2,"</code></td><td>");
  print_type(this,tconst->type_);
  std::operator<<((ostream *)poVar1,"</td><td><code>");
  print_const_value(this,tconst->type_,tconst->value_);
  std::operator<<((ostream *)poVar1,"</code></td></tr>");
  if ((tconst->super_t_doc).has_doc_ == true) {
    std::operator<<((ostream *)poVar1,"<tr><td colspan=\"3\"><blockquote>");
    print_doc(this,&tconst->super_t_doc);
    std::operator<<((ostream *)poVar1,"</blockquote></td></tr>");
  }
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void t_html_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  f_out_ << "<tr id=\"Const_" << name << "\"><td><code>" << name << "</code></td><td>";
  print_type(tconst->get_type());
  f_out_ << "</td><td><code>";
  print_const_value(tconst->get_type(), tconst->get_value());
  f_out_ << "</code></td></tr>";
  if (tconst->has_doc()) {
    f_out_ << "<tr><td colspan=\"3\"><blockquote>";
    print_doc(tconst);
    f_out_ << "</blockquote></td></tr>";
  }
}